

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O2

UniValue * __thiscall
DescribeAddressVisitor::operator()
          (UniValue *__return_storage_ptr__,DescribeAddressVisitor *this,WitnessV1Taproot *tap)

{
  string str;
  string key;
  string key_00;
  string key_01;
  string key_02;
  long in_FS_OFFSET;
  Span<const_unsigned_char> s;
  undefined7 in_stack_fffffffffffffdb8;
  allocator<char> in_stack_fffffffffffffdbf;
  allocator<char> aVar1;
  int in_stack_fffffffffffffdc0;
  int iVar2;
  undefined1 in_stack_fffffffffffffdc4 [20];
  UniValue in_stack_fffffffffffffdd8;
  string local_1c8 [32];
  UniValue local_1a8;
  string local_150 [32];
  UniValue local_130;
  string local_d8 [32];
  UniValue local_b8;
  string local_60 [32];
  undefined1 *local_40;
  undefined8 local_38;
  undefined1 local_30 [16];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_40 = local_30;
  local_38 = 0;
  local_30[0] = 0;
  str._M_dataplus._M_p._7_1_ = in_stack_fffffffffffffdbf;
  str._M_dataplus._M_p._0_7_ = in_stack_fffffffffffffdb8;
  str._M_string_length._0_4_ = in_stack_fffffffffffffdc0;
  str._12_20_ = in_stack_fffffffffffffdc4;
  UniValue::UniValue(__return_storage_ptr__,VOBJ,str);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::string<std::allocator<char>>
            (local_60,"isscript",(allocator<char> *)&stack0xfffffffffffffdc0);
  aVar1 = (allocator<char>)0x1;
  UniValue::UniValue<bool,_bool,_true>(&local_b8,(bool *)&stack0xfffffffffffffdbf);
  key._M_dataplus._M_p._7_1_ = aVar1;
  key._M_dataplus._M_p._0_7_ = in_stack_fffffffffffffdb8;
  key._M_string_length._0_4_ = in_stack_fffffffffffffdc0;
  key._12_20_ = in_stack_fffffffffffffdc4;
  UniValue::pushKV(__return_storage_ptr__,key,in_stack_fffffffffffffdd8);
  UniValue::~UniValue(&local_b8);
  std::__cxx11::string::~string(local_60);
  std::__cxx11::string::string<std::allocator<char>>
            (local_d8,"iswitness",(allocator<char> *)&stack0xfffffffffffffdc0);
  aVar1 = (allocator<char>)0x1;
  UniValue::UniValue<bool,_bool,_true>(&local_130,(bool *)&stack0xfffffffffffffdbf);
  key_00._M_dataplus._M_p._7_1_ = aVar1;
  key_00._M_dataplus._M_p._0_7_ = in_stack_fffffffffffffdb8;
  key_00._M_string_length._0_4_ = in_stack_fffffffffffffdc0;
  key_00._12_20_ = in_stack_fffffffffffffdc4;
  UniValue::pushKV(__return_storage_ptr__,key_00,in_stack_fffffffffffffdd8);
  UniValue::~UniValue(&local_130);
  std::__cxx11::string::~string(local_d8);
  std::__cxx11::string::string<std::allocator<char>>
            (local_150,"witness_version",(allocator<char> *)&stack0xfffffffffffffdbf);
  iVar2 = 1;
  UniValue::UniValue<int,_int,_true>(&local_1a8,(int *)&stack0xfffffffffffffdc0);
  key_01._M_dataplus._M_p._7_1_ = aVar1;
  key_01._M_dataplus._M_p._0_7_ = in_stack_fffffffffffffdb8;
  key_01._M_string_length._0_4_ = iVar2;
  key_01._12_20_ = in_stack_fffffffffffffdc4;
  UniValue::pushKV(__return_storage_ptr__,key_01,in_stack_fffffffffffffdd8);
  UniValue::~UniValue(&local_1a8);
  std::__cxx11::string::~string(local_150);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1c8,"witness_program",(allocator<char> *)&stack0xfffffffffffffdbf);
  s.m_size = 0x20;
  s.m_data = (uchar *)tap;
  HexStr_abi_cxx11_((string *)&stack0xfffffffffffffdc0,s);
  UniValue::
  UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            ((UniValue *)&stack0xfffffffffffffde0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &stack0xfffffffffffffdc0);
  key_02._M_dataplus._M_p._7_1_ = aVar1;
  key_02._M_dataplus._M_p._0_7_ = in_stack_fffffffffffffdb8;
  key_02._M_string_length._0_4_ = iVar2;
  key_02._12_20_ = in_stack_fffffffffffffdc4;
  UniValue::pushKV(__return_storage_ptr__,key_02,in_stack_fffffffffffffdd8);
  UniValue::~UniValue((UniValue *)&stack0xfffffffffffffde0);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffdc0);
  std::__cxx11::string::~string(local_1c8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

UniValue operator()(const WitnessV1Taproot& tap) const
    {
        UniValue obj(UniValue::VOBJ);
        obj.pushKV("isscript", true);
        obj.pushKV("iswitness", true);
        obj.pushKV("witness_version", 1);
        obj.pushKV("witness_program", HexStr(tap));
        return obj;
    }